

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::addImportSleepSupport(TranslateToFuzzReader *this)

{
  Module *module;
  bool bVar1;
  pointer pFVar2;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type *local_98;
  undefined8 local_90;
  Type local_88;
  Signature local_80;
  HeapType local_70;
  Name local_68;
  Name local_58 [2];
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_38;
  __single_object func;
  string_view local_20;
  TranslateToFuzzReader *local_10;
  TranslateToFuzzReader *this_local;
  
  if (((this->preserveImportsAndExports & 1U) == 0) &&
     (local_10 = this, bVar1 = oneIn(this,4), bVar1)) {
    module = this->wasm;
    Name::Name((Name *)&func,"sleep");
    local_20 = (string_view)Names::getValidFunctionName(module,(Name)_func);
    Name::operator=(&this->sleepImportName,(Name *)&local_20);
    std::make_unique<wasm::Function>();
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_38);
    Name::operator=((Name *)pFVar2,&this->sleepImportName);
    Name::Name(local_58,"fuzzing-support");
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_38);
    Name::operator=(&(pFVar2->super_Importable).module,local_58);
    Name::Name(&local_68,"sleep");
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_38);
    Name::operator=(&(pFVar2->super_Importable).base,&local_68);
    Type::Type(&local_a8,i32);
    Type::Type(&local_a0,i32);
    local_98 = &local_a8;
    local_90 = 2;
    wasm::Type::Type(&local_88,local_98,2);
    Type::Type(&local_b0,i32);
    Signature::Signature(&local_80,local_88,local_b0);
    wasm::HeapType::HeapType(&local_70,local_80);
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_38);
    (pFVar2->type).id = local_70.id;
    wasm::Module::addFunction((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_38);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addImportSleepSupport() {
  // Fuzz this somewhat rarely, as it may be slow, and only when we can add
  // imports.
  if (preserveImportsAndExports || !oneIn(4)) {
    return;
  }

  // An import that sleeps for a given number of milliseconds, and also receives
  // an integer id. It returns that integer id (useful for tracking separate
  // sleeps).
  sleepImportName = Names::getValidFunctionName(wasm, "sleep");
  auto func = std::make_unique<Function>();
  func->name = sleepImportName;
  func->module = "fuzzing-support";
  func->base = "sleep";
  func->type = Signature({Type::i32, Type::i32}, Type::i32);
  wasm.addFunction(std::move(func));
}